

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

_Bool av1_cnn_predict_img_multi_out_highbd
                (uint16_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,int bit_depth,CNN_MULTI_OUT *output)

{
  int iVar1;
  _Bool _Var2;
  void *pvVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  byte in_stack_00000008;
  _Bool success;
  int j_3;
  int i_4;
  int i_3;
  int i_2;
  int j_2;
  int j_1;
  int i_1;
  int j;
  int i;
  float *input;
  int c;
  int in_stride;
  float *input_;
  float *inputs [256];
  int in_channels;
  int in_height;
  int in_width;
  float max_val;
  CNN_THREAD_DATA *in_stack_000038d0;
  CNN_CONFIG *in_stack_000038d8;
  int in_stack_000038e4;
  int in_stack_000038e8;
  int in_stack_000038ec;
  float **in_stack_000038f0;
  CNN_MULTI_OUT *in_stack_00003900;
  void *in_stack_fffffffffffff770;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_858;
  long local_848 [257];
  int local_40;
  int local_3c;
  int local_38;
  float local_34;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  _Bool local_1;
  
  local_34 = (float)((1 << (in_stack_00000008 & 0x1f)) + -1);
  local_38 = in_ESI + *(int *)(in_R8 + 8) * 2;
  local_3c = in_EDX + *(int *)(in_R8 + 0xc) * 2;
  local_40 = *(int *)(in_R8 + 0x18);
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  pvVar3 = aom_malloc(0x51c2b0);
  iVar1 = local_38;
  if (pvVar3 == (void *)0x0) {
    local_1 = false;
  }
  else {
    for (local_858 = 0; local_858 < local_40; local_858 = local_858 + 1) {
      local_848[local_858] = (long)((long)pvVar3 + (long)(local_858 * iVar1 * local_3c) * 4);
      lVar4 = local_848[local_858] + (long)(*(int *)(local_28 + 0xc) * iVar1) * 4 +
              (long)*(int *)(local_28 + 8) * 4;
      if (*(int *)(local_28 + 0x10) == 0) {
        for (local_880 = -*(int *)(local_28 + 0xc); local_880 < local_18 + *(int *)(local_28 + 0xc);
            local_880 = local_880 + 1) {
          for (local_884 = -*(int *)(local_28 + 8); local_884 < local_14 + *(int *)(local_28 + 8);
              local_884 = local_884 + 1) {
            *(float *)(lVar4 + (long)(local_880 * iVar1 + local_884) * 4) =
                 (float)*(ushort *)
                         (*(long *)(local_10 + (long)local_858 * 8) +
                         (long)(local_880 * local_1c + local_884) * 2) / local_34;
          }
        }
      }
      else {
        for (local_864 = 0; local_864 < local_18; local_864 = local_864 + 1) {
          for (local_868 = 0; local_868 < local_14; local_868 = local_868 + 1) {
            *(float *)(lVar4 + (long)(local_864 * iVar1 + local_868) * 4) =
                 (float)*(ushort *)
                         (*(long *)(local_10 + (long)local_858 * 8) +
                         (long)(local_864 * local_1c + local_868) * 2) / local_34;
          }
        }
        for (local_86c = 0; local_86c < local_18; local_86c = local_86c + 1) {
          for (local_870 = -*(int *)(local_28 + 8); local_870 < 0; local_870 = local_870 + 1) {
            *(undefined4 *)(lVar4 + (long)(local_86c * iVar1 + local_870) * 4) =
                 *(undefined4 *)(lVar4 + (long)(local_86c * iVar1) * 4);
          }
          for (local_874 = local_14; local_874 < local_14 + *(int *)(local_28 + 8);
              local_874 = local_874 + 1) {
            *(undefined4 *)(lVar4 + (long)(local_86c * iVar1 + local_874) * 4) =
                 *(undefined4 *)(lVar4 + (long)(local_86c * iVar1 + local_14 + -1) * 4);
          }
        }
        for (local_878 = -*(int *)(local_28 + 0xc); local_878 < 0; local_878 = local_878 + 1) {
          memcpy((void *)(lVar4 + (long)(local_878 * iVar1 - *(int *)(local_28 + 8)) * 4),
                 (void *)(lVar4 + (long)-*(int *)(local_28 + 8) * 4),(long)local_38 << 2);
        }
        for (local_87c = local_18; local_87c < local_18 + *(int *)(local_28 + 0xc);
            local_87c = local_87c + 1) {
          memcpy((void *)(lVar4 + (long)(local_87c * iVar1 - *(int *)(local_28 + 8)) * 4),
                 (void *)(lVar4 + (long)((local_18 + -1) * iVar1 - *(int *)(local_28 + 8)) * 4),
                 (long)local_38 << 2);
        }
      }
    }
    _Var2 = av1_cnn_predict_c(in_stack_000038f0,in_stack_000038ec,in_stack_000038e8,
                              in_stack_000038e4,in_stack_000038d8,in_stack_000038d0,
                              in_stack_00003900);
    aom_free(in_stack_fffffffffffff770);
    local_1 = _Var2;
  }
  return local_1;
}

Assistant:

bool av1_cnn_predict_img_multi_out_highbd(uint16_t **dgd, int width, int height,
                                          int stride,
                                          const CNN_CONFIG *cnn_config,
                                          const CNN_THREAD_DATA *thread_data,
                                          int bit_depth,
                                          CNN_MULTI_OUT *output) {
  const float max_val = (float)((1 << bit_depth) - 1);

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }

  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}